

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O1

int gz_avail(gz_statep state)

{
  uInt *puVar1;
  uInt uVar2;
  uint uVar3;
  uchar *puVar4;
  Bytef *pBVar5;
  int iVar6;
  undefined8 in_RAX;
  long lVar7;
  uint got;
  uint local_14;
  
  local_14 = (uint)((ulong)in_RAX >> 0x20);
  iVar6 = -1;
  if ((state->err == 0) || (state->err == -5)) {
    if (state->eof == 0) {
      uVar2 = (state->strm).avail_in;
      if (uVar2 != 0) {
        puVar4 = state->in;
        pBVar5 = (state->strm).next_in;
        lVar7 = 0;
        do {
          puVar4[lVar7] = pBVar5[lVar7];
          lVar7 = lVar7 + 1;
        } while (uVar2 != (uInt)lVar7);
      }
      uVar3 = (state->strm).avail_in;
      iVar6 = gz_load(state,state->in + uVar3,state->size - uVar3,&local_14);
      if (iVar6 == -1) {
        return -1;
      }
      puVar1 = &(state->strm).avail_in;
      *puVar1 = *puVar1 + local_14;
      (state->strm).next_in = state->in;
    }
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

local int gz_avail(state)
    gz_statep state;
{
    unsigned got;
    z_streamp strm = &(state->strm);

    if (state->err != Z_OK && state->err != Z_BUF_ERROR)
        return -1;
    if (state->eof == 0) {
        if (strm->avail_in) {       /* copy what's there to the start */
            unsigned char *p = state->in;
            unsigned const char *q = strm->next_in;
            unsigned n = strm->avail_in;
            do {
                *p++ = *q++;
            } while (--n);
        }
        if (gz_load(state, state->in + strm->avail_in,
                    state->size - strm->avail_in, &got) == -1)
            return -1;
        strm->avail_in += got;
        strm->next_in = state->in;
    }
    return 0;
}